

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O1

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
               (long *range)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  
  plVar1 = (long *)*range;
  plVar2 = (long *)range[1];
  plVar5 = plVar2;
  if (plVar1 != plVar2) {
    do {
      plVar4 = plVar1 + 1;
      plVar5 = plVar2;
      if (plVar4 == plVar2) break;
      lVar3 = *plVar1;
      plVar5 = plVar4;
      plVar1 = plVar4;
    } while (lVar3 <= *plVar4);
  }
  if (plVar5 != plVar2) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>>, Value = long, Compare = std::less<void>]"
                 );
  }
  detail::
  skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
            ();
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }